

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall
libtorrent::torrent_finished_alert::~torrent_finished_alert(torrent_finished_alert *this)

{
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  operator_delete(this,0x30);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_finished_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT torrent_finished_alert(aux::stack_allocator& alloc,
			torrent_handle h);

		TORRENT_DEFINE_ALERT_PRIO(torrent_finished_alert, 26, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::status;
		std::string message() const override;
	}